

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O0

int buf_chain_new(nghttp2_buf_chain **chain,size_t chunk_length,nghttp2_mem *mem)

{
  int iVar1;
  nghttp2_buf_chain *pnVar2;
  int rv;
  nghttp2_mem *mem_local;
  size_t chunk_length_local;
  nghttp2_buf_chain **chain_local;
  
  pnVar2 = (nghttp2_buf_chain *)nghttp2_mem_malloc(mem,0x30);
  *chain = pnVar2;
  if (*chain == (nghttp2_buf_chain *)0x0) {
    chain_local._4_4_ = -0x385;
  }
  else {
    (*chain)->next = (nghttp2_buf_chain *)0x0;
    iVar1 = nghttp2_buf_init2(&(*chain)->buf,chunk_length,mem);
    if (iVar1 == 0) {
      chain_local._4_4_ = 0;
    }
    else {
      nghttp2_mem_free(mem,*chain);
      chain_local._4_4_ = -0x385;
    }
  }
  return chain_local._4_4_;
}

Assistant:

static int buf_chain_new(nghttp2_buf_chain **chain, size_t chunk_length,
                         nghttp2_mem *mem) {
  int rv;

  *chain = nghttp2_mem_malloc(mem, sizeof(nghttp2_buf_chain));
  if (*chain == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  (*chain)->next = NULL;

  rv = nghttp2_buf_init2(&(*chain)->buf, chunk_length, mem);
  if (rv != 0) {
    nghttp2_mem_free(mem, *chain);
    return NGHTTP2_ERR_NOMEM;
  }

  return 0;
}